

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

carrier_uint
fmt::v7::detail::dragonbox::cache_accessor<double>::compute_right_endpoint_for_shorter_interval_case
          (cache_entry_type *cache,int beta_minus_1)

{
  uint64_t uVar1;
  uint64_t uVar2;
  char in_SIL;
  uint128_wrapper *in_RDI;
  
  uVar1 = uint128_wrapper::high(in_RDI);
  uVar2 = uint128_wrapper::high(in_RDI);
  return uVar1 + (uVar2 >> 0x35) >> (0xbU - in_SIL & 0x3f);
}

Assistant:

static carrier_uint compute_right_endpoint_for_shorter_interval_case(
      const cache_entry_type& cache, int beta_minus_1) FMT_NOEXCEPT {
    return (cache.high() +
            (cache.high() >> (float_info<double>::significand_bits + 1))) >>
           (64 - float_info<double>::significand_bits - 1 - beta_minus_1);
  }